

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O0

reference __thiscall
jsoncons::jsonpath::detail::
function_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::evaluate(function_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *context,reference root,path_node_type *last,reference current,
          result_options options,error_code *ec)

{
  bool bVar1;
  base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *this_00;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_RCX;
  reference in_RDX;
  path_node_type *in_RSI;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_RDI;
  error_code *in_stack_00000008;
  value_type ref;
  result_options in_stack_000002bc;
  reference in_stack_000002c0;
  reference in_stack_000002c8;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_000002d0;
  token_evaluator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_000002d8;
  error_code *in_stack_000002f0;
  undefined8 in_stack_ffffffffffffff70;
  result_options options_00;
  reference in_stack_ffffffffffffff78;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffff80;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  error_code *in_stack_ffffffffffffffb0;
  undefined8 local_8;
  
  options_00 = (result_options)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  token_evaluator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::evaluate(in_stack_000002d8,in_stack_000002d0,in_stack_000002c8,in_stack_000002c0,
             in_stack_000002bc,in_stack_000002f0);
  bVar1 = std::error_code::operator_cast_to_bool(in_stack_00000008);
  if (bVar1) {
    local_8 = eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              ::null_value(in_stack_ffffffffffffff80);
  }
  else {
    this_00 = (base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
               *)eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
                 ::
                 create_json<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>
                           (in_RDI,in_stack_ffffffffffffff98);
    local_8 = base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              ::evaluate_tail(this_00,in_RCX,in_RDX,in_RSI,in_stack_ffffffffffffff78,options_00,
                              in_stack_ffffffffffffffb0);
  }
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x66d994);
  return local_8;
}

Assistant:

reference evaluate(eval_context<Json,JsonReference>& context,
                           reference root,
                           const path_node_type& last, 
                           reference current, 
                           result_options options,
                           std::error_code& ec) const override
        {
            value_type ref = expr_.evaluate(context, root, current, options, ec);
            if (!ec)
            {
                return this->evaluate_tail(context, root, last, *context.create_json(std::move(ref)), 
                    options, ec);
            }
            return context.null_value();
        }